

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O3

void __thiscall
iu_StringSplitLvalue_x_iutest_x_chain_at_last_by_stl_str_Test<char16_t>::Body
          (iu_StringSplitLvalue_x_iutest_x_chain_at_last_by_stl_str_Test<char16_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar4;
  AssertionResult iutest_ar;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> s;
  array<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_2UL>
  re;
  AssertionResult local_2c0;
  AssertionHelper local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  unsigned_long local_220;
  uint local_214;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_210;
  undefined1 local_1f0 [32];
  bool local_1d0;
  ios_base local_170 [264];
  array<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_2UL>
  local_68;
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::u16string::_M_construct<char16_t_const*>
            ((u16string *)&local_210,L"arikitari na_world!",L"");
  local_268 = &local_258;
  std::__cxx11::u16string::_M_construct<char16_t_const*>((u16string *)&local_268,L"_ ",L"");
  paVar1 = &local_298.m_part_result.super_iuCodeMessage.m_message.field_2;
  if (local_268 == &local_258) {
    local_298.m_part_result.super_iuCodeMessage.m_message.field_2._8_4_ = local_258._8_4_;
    local_298.m_part_result.super_iuCodeMessage.m_message.field_2._12_4_ = local_258._12_4_;
    local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_268;
  }
  local_298.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._2_2_ =
       local_258._M_allocated_capacity._2_2_;
  local_298.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_2_ =
       local_258._M_allocated_capacity._0_2_;
  local_298.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._4_4_ =
       local_258._M_allocated_capacity._4_4_;
  local_298.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_260;
  local_260 = 0;
  local_258._M_allocated_capacity._0_2_ = 0;
  local_268 = &local_258;
  detail::
  split_helper<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_false,_false,_true>
  ::operator>><detail::split_at_last,_nullptr>
            ((split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_char16_t>
              *)local_1f0);
  detail::
  operator|<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_char16_t,_nullptr>
            (&local_68,&local_210,
             (split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_char16_t>
              *)local_1f0);
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_298.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity * 2 + 2);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,
                    CONCAT44(local_258._M_allocated_capacity._4_4_,
                             CONCAT22(local_258._M_allocated_capacity._2_2_,
                                      local_258._M_allocated_capacity._0_2_)) * 2 + 2);
  }
  local_214 = 2;
  iutest::detail::ExpressionLHS<unsigned_int>::ExpressionLHS
            ((ExpressionLHS<unsigned_int> *)local_248,&local_214);
  local_220 = 2;
  iutest::detail::ExpressionLHS<unsigned_int>::operator==
            ((ExpressionResult *)&local_298,(ExpressionLHS<unsigned_int> *)local_248,&local_220);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1f0,(ExpressionResult *)&local_298,true);
  paVar2 = &local_2c0.m_message.field_2;
  local_2c0.m_message._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_1f0._0_8_,local_1f0._8_8_ + local_1f0._0_8_);
  local_2c0.m_result = local_1d0;
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_298.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._8_8_ != &local_230) {
    operator_delete((void *)local_248._8_8_,local_230._M_allocated_capacity + 1);
  }
  if (local_2c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1f0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_248,(internal *)&local_2c0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((2u == re.size()))",
               "false","true",(char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,(char *)local_248._0_8_,(allocator<char> *)&local_220);
    local_298.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_298.m_part_result.super_iuCodeMessage.m_line = 0xd3;
    local_298.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_298,(Fixed *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_298.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) goto LAB_00178908;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c0.m_message._M_dataplus._M_p,
                      local_2c0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1f0._0_8_ = L"arikitari na";
    iutest::internal::CmpHelperEQ<char16_t_const*,std::__cxx11::u16string>
              (&local_2c0,(internal *)"constant::arikitari_na<char_type>()","re[0]",local_1f0,
               (char16_t **)&local_68,in_R9);
    if (local_2c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1f0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,local_2c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)local_248);
      local_298.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_298.m_part_result.super_iuCodeMessage.m_line = 0xd4;
      local_298.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_298,(Fixed *)local_1f0);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.m_message._M_dataplus._M_p != paVar2) {
        operator_delete(local_2c0.m_message._M_dataplus._M_p,
                        local_2c0.m_message.field_2._M_allocated_capacity + 1);
      }
      local_1f0._0_8_ = L"world!";
      iutest::internal::CmpHelperEQ<char16_t_const*,std::__cxx11::u16string>
                (&local_2c0,(internal *)"constant::world<char_type>()","re[1]",local_1f0,
                 (char16_t **)(local_68._M_elems + 1),in_R9);
      if (local_2c0.m_result != false) goto LAB_00178931;
      memset((iu_global_format_stringstream *)local_1f0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,local_2c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)local_248);
      local_298.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_298.m_part_result.super_iuCodeMessage.m_line = 0xd5;
      local_298.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_298,(Fixed *)local_1f0);
    }
    local_248._16_8_ =
         local_298.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    local_248._0_8_ = local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
LAB_00178908:
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
  std::ios_base::~ios_base(local_170);
LAB_00178931:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_2c0.m_message._M_dataplus._M_p,
                    local_2c0.m_message.field_2._M_allocated_capacity + 1);
  }
  lVar3 = -0x40;
  paVar4 = &local_68._M_elems[1].field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],
                      paVar4->_M_allocated_capacity * 2 + 2);
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
              *)(&paVar4->_M_allocated_capacity + -4);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}